

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_map.cpp
# Opt level: O0

void __thiscall tst_helpers_map::modifyValues(tst_helpers_map *this)

{
  initializer_list<int> args;
  initializer_list<int> args_00;
  int local_cc [3];
  iterator local_c0;
  undefined8 local_b8;
  QList<int> local_b0;
  QList<int> local_98;
  QList<int> local_80;
  int local_54 [3];
  iterator local_48;
  undefined8 local_40;
  QList<int> local_38;
  undefined1 local_20 [8];
  PromiseType p;
  tst_helpers_map *this_local;
  
  local_54[0] = 0x2a;
  local_54[1] = 0x2b;
  local_54[2] = 0x2c;
  local_48 = local_54;
  local_40 = 3;
  args_00._M_len = 3;
  args_00._M_array = local_48;
  p.super_QPromiseBase<QList<int>_>.m_d.d = (PromiseData<QList<int>_> *)this;
  QList<int>::QList(&local_38,args_00);
  QtPromise::map<QList<int>,tst_helpers_map::modifyValues()::__0>(local_20,&local_38);
  QList<int>::~QList(&local_38);
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (int *)0x0;
  local_98.d.size = 0;
  QList<int>::QList(&local_98);
  waitForValue<QList<int>>(&local_80,(QPromise<QList<int>_> *)local_20,&local_98);
  local_cc[0] = 0x2b;
  local_cc[1] = 0x2c;
  local_cc[2] = 0x2d;
  local_c0 = local_cc;
  local_b8 = 3;
  args._M_len = 3;
  args._M_array = local_c0;
  QList<int>::QList(&local_b0,args);
  QTest::qCompare<int>
            (&local_80,&local_b0,"waitForValue(p, QVector<int>{})","(QVector<int>{43, 44, 45})",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_map.cpp"
             ,0x43);
  QList<int>::~QList(&local_b0);
  QList<int>::~QList(&local_80);
  QList<int>::~QList(&local_98);
  QtPromise::QPromise<QList<int>_>::~QPromise((QPromise<QList<int>_> *)local_20);
  return;
}

Assistant:

void tst_helpers_map::modifyValues()
{
    auto p = QtPromise::map(QVector<int>{42, 43, 44}, [](int v, ...) {
        return v + 1;
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(waitForValue(p, QVector<int>{}), (QVector<int>{43, 44, 45}));
}